

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O0

string * cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                   (string *__return_storage_ptr__,string *globalGenerator,string *extraGenerator)

{
  ulong uVar1;
  string *extraGenerator_local;
  string *globalGenerator_local;
  string *fullName;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)extraGenerator);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," - ");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)globalGenerator);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
  const std::string& globalGenerator, const std::string& extraGenerator)
{
  std::string fullName;
  if (!globalGenerator.empty()) {
    if (!extraGenerator.empty()) {
      fullName = extraGenerator;
      fullName += " - ";
    }
    fullName += globalGenerator;
  }
  return fullName;
}